

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupcat.c
# Opt level: O2

char * dupcat_fn(char *s1,...)

{
  char in_AL;
  size_t sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *__dest;
  undefined8 *puVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__dest_00;
  uint uVar6;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar1 = strlen(s1);
  puVar5 = (undefined8 *)&stack0x00000008;
  uVar6 = 8;
  while( true ) {
    if (uVar6 < 0x29) {
      uVar2 = (ulong)uVar6;
      uVar6 = uVar6 + 8;
      puVar3 = (undefined8 *)((long)local_e8 + uVar2);
    }
    else {
      puVar3 = puVar5;
      puVar5 = puVar5 + 1;
    }
    if ((char *)*puVar3 == (char *)0x0) break;
    sVar4 = strlen((char *)*puVar3);
    sVar1 = ((long)(sVar1 << 0x20) >> 0x20) + sVar4;
  }
  __dest = (char *)safemalloc((long)((sVar1 << 0x20) + 0x100000000) >> 0x20,1,0);
  strcpy(__dest,s1);
  sVar1 = strlen(__dest);
  __dest_00 = __dest + sVar1;
  uVar6 = 8;
  ap[0].overflow_arg_area = &stack0x00000008;
  while( true ) {
    uVar2 = (ulong)uVar6;
    if (uVar2 < 0x29) {
      uVar6 = uVar6 + 8;
      puVar5 = (undefined8 *)((long)local_e8 + uVar2);
    }
    else {
      puVar5 = (undefined8 *)ap[0].overflow_arg_area;
      ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
    }
    if ((char *)*puVar5 == (char *)0x0) break;
    strcpy(__dest_00,(char *)*puVar5);
    sVar1 = strlen(__dest_00);
    __dest_00 = __dest_00 + sVar1;
  }
  return __dest;
}

Assistant:

char *dupcat_fn(const char *s1, ...)
{
    int len;
    char *p, *q, *sn;
    va_list ap;

    len = strlen(s1);
    va_start(ap, s1);
    while (1) {
        sn = va_arg(ap, char *);
        if (!sn)
            break;
        len += strlen(sn);
    }
    va_end(ap);

    p = snewn(len + 1, char);
    strcpy(p, s1);
    q = p + strlen(p);

    va_start(ap, s1);
    while (1) {
        sn = va_arg(ap, char *);
        if (!sn)
            break;
        strcpy(q, sn);
        q += strlen(q);
    }
    va_end(ap);

    return p;
}